

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O3

void __thiscall
HighsSymmetryDetection::run(HighsSymmetryDetection *this,HighsSymmetries *symmetries)

{
  int iVar1;
  HighsSplitDeque *this_00;
  bool bVar2;
  HighsSymmetries *pHVar3;
  HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *pHVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  bool bVar5;
  bool bVar6;
  HighsInt HVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  undefined8 *puVar11;
  pointer puVar12;
  pointer puVar13;
  pointer piVar14;
  ulong uVar15;
  ulong uVar16;
  pointer piVar17;
  pointer pNVar18;
  pointer piVar19;
  int iVar20;
  KeyType_conflict *key;
  long lVar21;
  pointer piVar22;
  uint uVar23;
  pointer pNVar24;
  long lVar25;
  HighsSymmetries *pHVar26;
  bool bVar27;
  int iVar28;
  HighsInt *pHVar29;
  u8 meta_1;
  u8 meta;
  u64 maxPos;
  u64 startPos;
  u64 pos;
  HighsInt wrongCell;
  ComponentData componentData;
  int local_1d8;
  u8 local_1d1;
  HighsSymmetries *local_1d0;
  int local_1c4;
  HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *local_1c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1b8;
  vector<int,std::allocator<int>> *local_1b0;
  HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *local_1a8;
  vector<int,_std::allocator<int>_> *local_1a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_198;
  u64 local_190;
  u64 local_188;
  u64 local_180;
  vector<int,_std::allocator<int>_> *local_178;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_170;
  vector<int,_std::allocator<int>_> *local_168;
  HighsHashTable<int,_void> local_160;
  ComponentData local_138;
  
  initializeGroundSet(this);
  puVar12 = (this->currNodeCertificate).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->currNodeCertificate).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar12) {
    (this->currNodeCertificate).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar12;
  }
  piVar22 = (this->cellCreationStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->cellCreationStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar22) {
    (this->cellCreationStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar22;
  }
  local_1d0 = symmetries;
  createNode(this);
  local_1c4 = (int)(64000000 / (long)this->numActiveCols);
  HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
  puVar11 = (undefined8 *)__tls_get_addr(&PTR_00441ef0);
  pNVar24 = (this->nodeStack).
            super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pNVar18 = (this->nodeStack).
            super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pNVar24 != pNVar18) {
    local_198 = &this->currNodeCertificate;
    this_00 = (HighsSplitDeque *)*puVar11;
    local_168 = &this->firstLeavePartition;
    local_1b8 = &this->bestLeaveCertificate;
    local_1a8 = &this->bestLeaveGraph;
    local_1a0 = &this->currentPartition;
    local_178 = &this->bestLeavePartition;
    local_1c0 = &this->firstLeaveGraph;
    local_1b0 = (vector<int,std::allocator<int>> *)&local_1d0->permutations;
    local_170 = &this->firstLeaveCertificate;
    do {
      HVar7 = selectTargetCell(this);
      if (HVar7 == -1) {
        if ((this->firstLeavePartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (this->firstLeavePartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<int,_std::allocator<int>_>::operator=(local_168,local_1a0);
          __x = local_198;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(local_170,local_198);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(local_1b8,__x);
          dumpCurrentGraph((HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)&local_138,
                           this);
          HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::operator=
                    (local_1c0,
                     (HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)&local_138);
          HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::~HighsHashTable
                    ((HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)&local_138);
          puVar12 = (this->currNodeCertificate).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          pNVar24 = (this->nodeStack).
                    super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar16 = (long)(this->nodeStack).
                         super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar24;
          uVar15 = uVar16 >> 4;
          iVar28 = (int)uVar15;
          this->firstPathDepth = iVar28;
          this->bestPathDepth = iVar28;
          HVar7 = (HighsInt)
                  ((ulong)((long)puVar12 -
                          (long)(this->currNodeCertificate).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2);
          this->firstLeavePrefixLen = HVar7;
          iVar10 = 1;
          if (iVar28 < 1) {
            iVar10 = iVar28;
          }
          this->bestLeavePrefixLen = HVar7;
          pHVar29 = (HighsInt *)((long)pNVar24 + ((uVar16 & 0xffffffff0) - 0x18));
          do {
            uVar9 = iVar10 - 1;
            if ((int)uVar15 < 2) break;
            bVar5 = isFromBinaryColumn(this,*pHVar29);
            pHVar29 = pHVar29 + -4;
            uVar9 = (int)uVar15 - 1;
            uVar15 = (ulong)uVar9;
          } while (!bVar5);
        }
        else {
          local_160.entries._M_t.
          super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>
          ._M_t.
          super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>
          .super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>._M_head_impl._0_4_ = -1;
          uVar16 = (ulong)((long)pNVar18 - (long)pNVar24) >> 4;
          uVar23 = (int)uVar16 - 1;
          puVar12 = (this->currNodeCertificate).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          puVar13 = (this->currNodeCertificate).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          iVar10 = (int)((ulong)((long)puVar13 - (long)puVar12) >> 2);
          uVar9 = uVar23;
          if (this->firstLeavePrefixLen == iVar10) {
            bVar5 = compareCurrentGraph(this,local_1c0,(HighsInt *)&local_160);
            if (bVar5) {
              uVar8 = this->numAutomorphisms;
              this->numAutomorphisms = uVar8 + 1;
              if (0 < this->numVertices) {
                piVar14 = (this->automorphisms).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start +
                          (int)(this->numVertices * (uVar8 & 0x3f));
                piVar22 = (this->firstLeavePartition).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                piVar19 = (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                piVar17 = (this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                lVar25 = 0;
                do {
                  piVar14[piVar17[piVar19[lVar25]]] = piVar22[lVar25];
                  lVar25 = lVar25 + 1;
                } while (lVar25 < this->numVertices);
                if (0 < this->numVertices) {
                  lVar25 = 0;
                  bVar5 = false;
                  do {
                    bVar27 = bVar5;
                    bVar6 = mergeOrbits(this,piVar14[lVar25],
                                        (this->vertexGroundSet).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start[lVar25]);
                    pHVar3 = local_1d0;
                    bVar2 = lVar25 < this->numActiveCols;
                    lVar25 = lVar25 + 1;
                    bVar5 = (bool)(bVar27 | (bVar2 && bVar6));
                  } while (lVar25 < this->numVertices);
                  if (bVar27 || bVar2 && bVar6) {
                    std::vector<int,std::allocator<int>>::_M_range_insert<int*>
                              (local_1b0,
                               (local_1d0->permutations).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish,piVar14);
                    iVar10 = pHVar3->numPerms + 1;
                    pHVar3->numPerms = iVar10;
                    if (iVar10 == local_1c4) break;
                  }
                }
              }
              uVar8 = this->firstPathDepth;
LAB_002fc193:
              if ((int)uVar8 < (int)uVar23) {
                uVar9 = uVar8;
              }
            }
            else {
              iVar10 = this->bestLeavePrefixLen;
              puVar12 = (this->currNodeCertificate).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              puVar13 = (this->currNodeCertificate).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
LAB_002fc06d:
              if (((this->bestLeavePartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start !=
                   (this->bestLeavePartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish) &&
                 (iVar10 == (int)((ulong)((long)puVar13 - (long)puVar12) >> 2))) {
                bVar5 = compareCurrentGraph(this,local_1a8,(HighsInt *)&local_160);
                if (bVar5) {
                  uVar8 = this->numAutomorphisms;
                  this->numAutomorphisms = uVar8 + 1;
                  if (0 < this->numVertices) {
                    piVar14 = (this->automorphisms).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start +
                              (int)(this->numVertices * (uVar8 & 0x3f));
                    piVar22 = (this->bestLeavePartition).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    piVar19 = (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    piVar17 = (this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    lVar25 = 0;
                    do {
                      piVar14[piVar17[piVar19[lVar25]]] = piVar22[lVar25];
                      lVar25 = lVar25 + 1;
                    } while (lVar25 < this->numVertices);
                    if (0 < this->numVertices) {
                      lVar25 = 0;
                      bVar5 = false;
                      do {
                        bVar27 = bVar5;
                        bVar6 = mergeOrbits(this,piVar14[lVar25],
                                            (this->vertexGroundSet).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start[lVar25]);
                        pHVar3 = local_1d0;
                        bVar2 = lVar25 < this->numActiveCols;
                        lVar25 = lVar25 + 1;
                        bVar5 = (bool)(bVar27 | (bVar2 && bVar6));
                      } while (lVar25 < this->numVertices);
                      if (bVar27 || bVar2 && bVar6) {
                        std::vector<int,std::allocator<int>>::_M_range_insert<int*>
                                  (local_1b0,
                                   (local_1d0->permutations).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish,piVar14);
                        iVar10 = pHVar3->numPerms + 1;
                        pHVar3->numPerms = iVar10;
                        if (iVar10 == local_1c4) break;
                      }
                    }
                  }
                  uVar8 = this->bestPathDepth;
                  goto LAB_002fc193;
                }
                iVar10 = this->bestLeavePrefixLen;
                puVar12 = (this->currNodeCertificate).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                puVar13 = (this->currNodeCertificate).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              }
              if ((iVar10 < (int)((ulong)((long)puVar13 - (long)puVar12) >> 2)) &&
                 ((local_1b8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start[iVar10] < puVar12[iVar10])) {
                uVar9 = this->firstPathDepth - 2;
                pHVar29 = &(this->nodeStack).
                           super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                           ._M_impl.super__Vector_impl_data._M_start[this->firstPathDepth + -1].
                           certificateEnd;
                do {
                  uVar9 = uVar9 + 1;
                  iVar28 = *pHVar29;
                  pHVar29 = pHVar29 + 4;
                } while (iVar28 <= iVar10);
                if ((int)uVar23 < (int)uVar9) {
                  uVar9 = uVar23;
                }
              }
              else if (-1 < (int)uVar23) {
                do {
                  uVar23 = (int)uVar16 - 1;
                  if ((this->nodeStack).
                      super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar23].targetCell ==
                      (int)local_160.entries._M_t.
                           super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>
                           .super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>.
                           _M_head_impl) {
                    uVar9 = (int)uVar16 - 1;
                    break;
                  }
                  uVar16 = (ulong)uVar23;
                } while (0 < (int)uVar23);
              }
            }
          }
          else {
            if (this->bestLeavePrefixLen == iVar10) goto LAB_002fc06d;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(local_1b8,local_198)
            ;
            dumpCurrentGraph((HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)&local_138,
                             this);
            HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::operator=
                      (local_1a8,
                       (HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)&local_138);
            HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::~HighsHashTable
                      ((HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)&local_138);
            std::vector<int,_std::allocator<int>_>::operator=(local_178,local_1a0);
            puVar12 = (this->currNodeCertificate).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            this->bestPathDepth =
                 (HighsInt)
                 ((ulong)((long)(this->nodeStack).
                                super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->nodeStack).
                               super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
            this->bestLeavePrefixLen =
                 (HighsInt)
                 ((ulong)((long)puVar12 -
                         (long)(this->currNodeCertificate).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
          }
        }
        switchToNextNode(this,uVar9);
        HighsSplitDeque::checkInterrupt(this_00);
      }
      else {
        pNVar18[-1].targetCell = HVar7;
        determineNextToDistinguish(this);
        bVar5 = distinguishVertex(this,HVar7);
        if (bVar5) {
          bVar5 = partitionRefinement(this);
          if (bVar5) {
            createNode(this);
            goto LAB_002fc24d;
          }
          HVar7 = (HighsInt)
                  ((ulong)((long)(this->nodeStack).
                                 super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->nodeStack).
                                super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4);
        }
        else {
          HVar7 = (int)((ulong)((long)(this->nodeStack).
                                      super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->nodeStack).
                                     super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1;
        }
        switchToNextNode(this,HVar7);
      }
LAB_002fc24d:
      pNVar24 = (this->nodeStack).
                super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pNVar18 = (this->nodeStack).
                super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (pNVar24 != pNVar18);
  }
  pHVar3 = local_1d0;
  local_1d0->numGenerators = local_1d0->numPerms;
  if (0 < local_1d0->numPerms) {
    std::vector<int,_std::allocator<int>_>::resize(&this->vertexPosition,(long)this->numCol);
    computeComponentData(&local_138,this,pHVar3);
    uVar9 = (int)((ulong)((long)local_138.componentStarts.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)local_138.componentStarts.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2) - 1;
    if (0 < (int)uVar9) {
      uVar16 = 0;
      do {
        if (local_138.componentStarts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar16 + 1] -
            local_138.componentStarts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar16] != 1) {
          isFullOrbitope(this,&local_138,(HighsInt)uVar16,pHVar3);
        }
        uVar16 = uVar16 + 1;
      } while (uVar9 != uVar16);
    }
    local_1c0 = (HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)&this->vertexPosition;
    HighsHashTable<int,_void>::HighsHashTable(&local_160);
    local_1d8 = 0;
    pHVar26 = pHVar3;
    if (0 < pHVar3->numPerms) {
      do {
        iVar10 = this->numActiveCols;
        if (0 < iVar10) {
          key = (local_1d0->permutations).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + local_1d8 * iVar10;
          lVar25 = 0;
          do {
            if (*key != (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar25]) {
              bVar5 = HighsHashTable<int,_int>::findPosition
                                (&pHVar3->columnToOrbitope,key,&local_1d1,&local_188,&local_190,
                                 &local_180);
              if (bVar5) {
                HighsHashTable<int,void>::insert<int&>
                          ((HighsHashTable<int,void> *)&local_160,&local_1d8);
                break;
              }
              iVar10 = this->numActiveCols;
            }
            lVar25 = lVar25 + 1;
            key = key + 1;
          } while (lVar25 < iVar10);
        }
        local_1d8 = local_1d8 + 1;
        pHVar26 = local_1d0;
      } while (local_1d8 < local_1d0->numPerms);
    }
    iVar10 = this->numActiveCols;
    if (0 < iVar10) {
      lVar21 = 0;
      lVar25 = 0;
      iVar28 = 0;
      do {
        HVar7 = getOrbit(this,*(HighsInt *)
                               ((long)(this->vertexGroundSet).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start + lVar21));
        if (((this->orbitSize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[HVar7] == 1) ||
           (bVar5 = HighsHashTable<int,_int>::findPosition
                              (&pHVar26->columnToOrbitope,
                               (KeyType_conflict *)
                               ((long)(this->vertexGroundSet).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start + lVar21),(u8 *)&local_1d8,
                               &local_188,&local_190,&local_180), bVar5)) {
          piVar22 = (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          (this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[*(int *)((long)piVar22 + lVar21)] = -1;
          *(undefined4 *)((long)piVar22 + lVar21) = 0xffffffff;
          iVar28 = iVar28 + 1;
        }
        lVar25 = lVar25 + 1;
        iVar10 = this->numActiveCols;
        lVar21 = lVar21 + 4;
      } while (lVar25 < iVar10);
      pHVar26 = local_1d0;
      if (iVar28 != 0) {
        local_1d8 = 0;
        lVar25 = (long)local_1d0->numPerms * (long)iVar10;
        if ((int)lVar25 != 0) {
          piVar19 = (local_1d0->permutations).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar17 = piVar19 + lVar25;
          piVar22 = piVar19;
          do {
            bVar5 = HighsHashTable<int,_void>::findPosition
                              (&local_160,&local_1d8,&local_1d1,&local_188,&local_190,&local_180);
            if (bVar5 && CONCAT44(local_160.entries._M_t.
                                  super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>
                                  .super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>.
                                  _M_head_impl._4_4_,
                                  (int)local_160.entries._M_t.
                                       super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>
                                       .
                                       super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>
                                       ._M_head_impl) != 0) {
              local_1d0->numPerms = local_1d0->numPerms + -1;
              iVar10 = this->numActiveCols;
            }
            else {
              iVar10 = this->numActiveCols;
              if (0 < iVar10) {
                piVar14 = (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                lVar25 = 0;
                do {
                  if (piVar14[lVar25] != -1) {
                    *piVar19 = piVar22[lVar25];
                    piVar19 = piVar19 + 1;
                    iVar10 = this->numActiveCols;
                  }
                  lVar25 = lVar25 + 1;
                } while (lVar25 < iVar10);
              }
            }
            piVar22 = piVar22 + iVar10;
            local_1d8 = local_1d8 + 1;
          } while (piVar22 != piVar17);
        }
        if (0 < iVar10) {
          piVar22 = (this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar19 = (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar25 = 0;
          iVar20 = 0;
          do {
            iVar1 = piVar19[lVar25];
            if ((long)iVar1 != -1) {
              piVar19[iVar20] = iVar1;
              piVar22[iVar1] = iVar20;
              iVar20 = iVar20 + 1;
              iVar10 = this->numActiveCols;
            }
            lVar25 = lVar25 + 1;
          } while (lVar25 < iVar10);
        }
        iVar10 = iVar10 - iVar28;
        this->numActiveCols = iVar10;
        pHVar26 = local_1d0;
      }
    }
    std::vector<int,_std::allocator<int>_>::resize(&this->vertexGroundSet,(long)iVar10);
    pHVar4 = local_1c0;
    piVar22 = (pHVar26->permutationColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar19 = (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (pHVar26->permutationColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start;
    (pHVar26->permutationColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar19;
    (pHVar26->permutationColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (piVar22 != (pointer)0x0) {
      operator_delete(piVar22);
    }
    piVar22 = (pHVar26->columnPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar19 = (this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (pHVar26->columnPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start;
    (pHVar26->columnPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar19;
    (pHVar26->columnPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (((_Vector_base<int,_std::allocator<int>_> *)&pHVar4->entries)->_M_impl).super__Vector_impl_data
    ._M_start = (pointer)0x0;
    (((_Vector_base<int,_std::allocator<int>_> *)&pHVar4->entries)->_M_impl).super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    (((_Vector_base<int,_std::allocator<int>_> *)&pHVar4->entries)->_M_impl).super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    if (piVar22 != (pointer)0x0) {
      operator_delete(piVar22);
    }
    std::vector<int,_std::allocator<int>_>::resize
              (&pHVar26->permutations,(long)this->numActiveCols * (long)pHVar26->numPerms);
    HighsHashTable<int,_void>::~HighsHashTable(&local_160);
    ComponentData::~ComponentData(&local_138);
  }
  return;
}

Assistant:

void HighsSymmetryDetection::run(HighsSymmetries& symmetries) {
  assert(numActiveCols != 0);
  initializeGroundSet();
  currNodeCertificate.clear();
  cellCreationStack.clear();
  createNode();
  HighsInt maxPerms = 64000000 / numActiveCols;
  HighsSplitDeque* workerDeque = HighsTaskExecutor::getThisWorkerDeque();
  while (!nodeStack.empty()) {
    HighsInt targetCell = selectTargetCell();
    if (targetCell == -1) {
      if (firstLeavePartition.empty()) {
        firstLeavePartition = currentPartition;
        firstLeaveCertificate = currNodeCertificate;
        bestLeaveCertificate = currNodeCertificate;
        firstLeaveGraph = dumpCurrentGraph();
        firstPathDepth = nodeStack.size();
        bestPathDepth = nodeStack.size();
        firstLeavePrefixLen = currNodeCertificate.size();
        bestLeavePrefixLen = currNodeCertificate.size();

        HighsInt backtrackDepth = firstPathDepth - 1;
        while (backtrackDepth > 0 &&
               !isFromBinaryColumn(nodeStack[backtrackDepth - 1].targetCell))
          --backtrackDepth;
        switchToNextNode(backtrackDepth);
      } else {
        HighsInt wrongCell = -1;
        HighsInt backtrackDepth = nodeStack.size() - 1;
        assert(currNodeCertificate.size() == firstLeaveCertificate.size());
        if (firstLeavePrefixLen == (HighsInt)currNodeCertificate.size() ||
            bestLeavePrefixLen == (HighsInt)currNodeCertificate.size()) {
          if (firstLeavePrefixLen == (HighsInt)currNodeCertificate.size() &&
              compareCurrentGraph(firstLeaveGraph, wrongCell)) {
            HighsInt k = (numAutomorphisms++) & 63;
            HighsInt* permutation = automorphisms.data() + k * numVertices;
            for (HighsInt i = 0; i < numVertices; ++i) {
              HighsInt firstLeaveCol = firstLeavePartition[i];
              permutation[vertexPosition[currentPartition[i]]] = firstLeaveCol;
            }

            bool report = false;
            for (HighsInt i = 0; i < numVertices; ++i) {
              if (mergeOrbits(permutation[i], vertexGroundSet[i]) &&
                  i < numActiveCols) {
                assert(permutation[i] < numCol);
                report = true;
              }
            }

            if (report) {
              symmetries.permutations.insert(symmetries.permutations.end(),
                                             permutation,
                                             permutation + numActiveCols);
              ++symmetries.numPerms;
              if (symmetries.numPerms == maxPerms) break;
            }
            backtrackDepth = std::min(backtrackDepth, firstPathDepth);
          } else if (!bestLeavePartition.empty() &&
                     bestLeavePrefixLen ==
                         (HighsInt)currNodeCertificate.size() &&
                     compareCurrentGraph(bestLeaveGraph, wrongCell)) {
            HighsInt k = (numAutomorphisms++) & 63;
            HighsInt* permutation = automorphisms.data() + k * numVertices;
            for (HighsInt i = 0; i < numVertices; ++i) {
              HighsInt bestLeaveCol = bestLeavePartition[i];
              permutation[vertexPosition[currentPartition[i]]] = bestLeaveCol;
            }

            bool report = false;
            for (HighsInt i = 0; i < numVertices; ++i) {
              if (mergeOrbits(permutation[i], vertexGroundSet[i]) &&
                  i < numActiveCols) {
                assert(permutation[i] < numCol);
                report = true;
              }
            }

            if (report) {
              symmetries.permutations.insert(symmetries.permutations.end(),
                                             permutation,
                                             permutation + numActiveCols);
              ++symmetries.numPerms;
              if (symmetries.numPerms == maxPerms) break;
            }

            backtrackDepth = std::min(backtrackDepth, bestPathDepth);
          } else if (bestLeavePrefixLen <
                         (HighsInt)currNodeCertificate.size() &&
                     currNodeCertificate[bestLeavePrefixLen] >
                         bestLeaveCertificate[bestLeavePrefixLen]) {
            // certificate value is lexicographically above the smallest one
            // seen so far, so we might be able to backtrack to a higher level
            HighsInt possibleBacktrackDepth = firstPathDepth - 1;
            while (nodeStack[possibleBacktrackDepth].certificateEnd <=
                   bestLeavePrefixLen)
              ++possibleBacktrackDepth;

            backtrackDepth = std::min(possibleBacktrackDepth, backtrackDepth);
          } else {
            // This case can be caused by a hash collision which was now
            // detected in the graph comparison call. The graph comparison call
            // will return the cell where the vertex neighbourhood caused a
            // mismatch on the edges. This would have been detected by
            // an exact partition refinement when we targeted that cell the last
            // time, so that is where we can backtrack to.
            HighsInt possibleBacktrackDepth;
            for (possibleBacktrackDepth = backtrackDepth;
                 possibleBacktrackDepth >= 0; --possibleBacktrackDepth) {
              if (nodeStack[possibleBacktrackDepth].targetCell == wrongCell) {
                backtrackDepth = possibleBacktrackDepth;
                break;
              }
            }
          }
        } else {
          // leave must have a lexicographically smaller certificate value
          // than the current best leave, because its prefix length is smaller
          // than the best leaves and it would have been already pruned if
          // it's certificate value was larger unless it is equal to the first
          // leaf nodes certificate value which is caught by the first case
          // of the if condition. Hence, having a lexicographically smaller
          // certificate value than the best leave is the only way to get
          // here.
          assert(bestLeaveCertificate[bestLeavePrefixLen] >
                     currNodeCertificate[bestLeavePrefixLen] &&
                 std::memcmp(bestLeaveCertificate.data(),
                             currNodeCertificate.data(),
                             bestLeavePrefixLen * sizeof(u32)) == 0);
          bestLeaveCertificate = currNodeCertificate;
          bestLeaveGraph = dumpCurrentGraph();
          bestLeavePartition = currentPartition;
          bestPathDepth = nodeStack.size();
          bestLeavePrefixLen = currNodeCertificate.size();
        }

        switchToNextNode(backtrackDepth);
      }

      workerDeque->checkInterrupt();
    } else {
      Node& currNode = nodeStack.back();
      currNode.targetCell = targetCell;
      bool success = determineNextToDistinguish();
      assert(success);
      if (!distinguishVertex(targetCell)) {
        switchToNextNode(nodeStack.size() - 1);
        continue;
      }
      if (!partitionRefinement()) {
        switchToNextNode(nodeStack.size());
        continue;
      }

      createNode();
    }
  }

  symmetries.numGenerators = symmetries.numPerms;
  if (symmetries.numPerms > 0) {
    vertexPosition.resize(numCol);

    ComponentData componentData = computeComponentData(symmetries);
    HighsInt numComponents = componentData.numComponents();

    for (HighsInt i = 0; i < numComponents; ++i) {
      if (componentData.componentSize(i) == 1) continue;

      isFullOrbitope(componentData, i, symmetries);
    }

    HighsHashTable<HighsInt> deletedPerms;
    for (HighsInt p = 0; p < symmetries.numPerms; ++p) {
      HighsInt* perm = symmetries.permutations.data() + p * numActiveCols;
      for (HighsInt i = 0; i < numActiveCols; ++i) {
        if (perm[i] != vertexGroundSet[i] &&
            symmetries.columnToOrbitope.find(perm[i])) {
          deletedPerms.insert(p);
          break;
        }
      }
    }

    // check which columns have non-trivial orbits
    HighsInt numFixed = 0;
    for (HighsInt i = 0; i < numActiveCols; ++i) {
      if (orbitSize[getOrbit(vertexGroundSet[i])] == 1 ||
          symmetries.columnToOrbitope.find(vertexGroundSet[i])) {
        vertexPosition[vertexGroundSet[i]] = -1;
        vertexGroundSet[i] = -1;
        numFixed += 1;
      }
    }

    if (numFixed != 0) {
      // now compress symmetries and the groundset to only contain the unfixed
      // columns and columns not handled by full orbitopes
      HighsInt p = 0;
      HighsInt* perms = symmetries.permutations.data();
      HighsInt* permEnd =
          symmetries.permutations.data() + symmetries.numPerms * numActiveCols;
      HighsInt* permOutput = symmetries.permutations.data();
      while (perms != permEnd) {
        if (!deletedPerms.find(p)) {
          for (HighsInt i = 0; i < numActiveCols; ++i) {
            if (vertexGroundSet[i] == -1) continue;

            *permOutput = perms[i];
            ++permOutput;
          }
        } else {
          --symmetries.numPerms;
        }
        perms += numActiveCols;
        ++p;
      }

      HighsInt outPos = 0;
      for (HighsInt i = 0; i < numActiveCols; ++i) {
        if (vertexGroundSet[i] == -1) continue;

        vertexGroundSet[outPos] = vertexGroundSet[i];
        vertexPosition[vertexGroundSet[outPos]] = outPos;
        outPos += 1;
      }

      numActiveCols -= numFixed;
      assert(permOutput == symmetries.permutations.data() +
                               symmetries.numPerms * numActiveCols);
    }

    vertexGroundSet.resize(numActiveCols);
    symmetries.permutationColumns = std::move(vertexGroundSet);
    symmetries.columnPosition = std::move(vertexPosition);
    symmetries.permutations.resize(symmetries.numPerms * numActiveCols);
  }
}